

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugLine::ParsingState::appendRowToMatrix(ParsingState *this)

{
  Sequence *__args;
  undefined1 *puVar1;
  pointer *ppRVar2;
  pointer *ppSVar3;
  LineTable *pLVar4;
  iterator __position;
  iterator __position_00;
  uint64_t uVar5;
  uint64_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint32_t uVar9;
  uint8_t uVar10;
  undefined3 uVar11;
  undefined7 uVar12;
  uint uVar13;
  uint uVar14;
  
  pLVar4 = this->LineTable;
  uVar14 = (uint)((ulong)((long)(pLVar4->Rows).
                                super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pLVar4->Rows).
                               super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if ((this->Sequence).Empty == true) {
    (this->Sequence).Empty = false;
    (this->Sequence).LowPC = (this->Row).Address.Address;
    (this->Sequence).FirstRowIndex = uVar14;
  }
  __position._M_current =
       (pLVar4->Rows).
       super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pLVar4->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::DWARFDebugLine::Row,std::allocator<llvm::DWARFDebugLine::Row>>::
    _M_realloc_insert<llvm::DWARFDebugLine::Row_const&>
              ((vector<llvm::DWARFDebugLine::Row,std::allocator<llvm::DWARFDebugLine::Row>> *)
               &pLVar4->Rows,__position,&this->Row);
  }
  else {
    uVar5 = (this->Row).Address.Address;
    uVar6 = (this->Row).Address.SectionIndex;
    uVar7 = (this->Row).Column;
    uVar8 = (this->Row).File;
    uVar9 = (this->Row).Discriminator;
    uVar10 = (this->Row).Isa;
    uVar11 = *(undefined3 *)&(this->Row).field_0x1d;
    (__position._M_current)->Line = (this->Row).Line;
    (__position._M_current)->Column = uVar7;
    (__position._M_current)->File = uVar8;
    (__position._M_current)->Discriminator = uVar9;
    (__position._M_current)->Isa = uVar10;
    *(undefined3 *)&(__position._M_current)->field_0x1d = uVar11;
    ((__position._M_current)->Address).Address = uVar5;
    ((__position._M_current)->Address).SectionIndex = uVar6;
    ppRVar2 = &(pLVar4->Rows).
               super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar2 = *ppRVar2 + 1;
  }
  if (((this->Row).field_0x1d & 4) != 0) {
    __args = &this->Sequence;
    (this->Sequence).LastRowIndex = uVar14 + 1;
    uVar5 = (this->Row).Address.SectionIndex;
    (this->Sequence).HighPC = (this->Row).Address.Address;
    (this->Sequence).SectionIndex = uVar5;
    if ((((this->Sequence).Empty == false) && ((this->Sequence).LowPC < (this->Sequence).HighPC)) &&
       ((this->Sequence).FirstRowIndex < (this->Sequence).LastRowIndex)) {
      pLVar4 = this->LineTable;
      __position_00._M_current =
           (pLVar4->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (pLVar4->Sequences).
          super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>::
        _M_realloc_insert<llvm::DWARFDebugLine::Sequence_const&>
                  ((vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>
                    *)&pLVar4->Sequences,__position_00,__args);
      }
      else {
        uVar12 = *(undefined7 *)&(this->Sequence).field_0x21;
        (__position_00._M_current)->Empty = (this->Sequence).Empty;
        *(undefined7 *)&(__position_00._M_current)->field_0x21 = uVar12;
        uVar5 = __args->LowPC;
        uVar6 = (this->Sequence).HighPC;
        uVar14 = (this->Sequence).FirstRowIndex;
        uVar13 = (this->Sequence).LastRowIndex;
        (__position_00._M_current)->SectionIndex = (this->Sequence).SectionIndex;
        (__position_00._M_current)->FirstRowIndex = uVar14;
        (__position_00._M_current)->LastRowIndex = uVar13;
        (__position_00._M_current)->LowPC = uVar5;
        (__position_00._M_current)->HighPC = uVar6;
        ppSVar3 = &(pLVar4->Sequences).
                   super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar3 = *ppSVar3 + 1;
      }
    }
    __args->LowPC = 0;
    (this->Sequence).HighPC = 0;
    (this->Sequence).SectionIndex = 0xffffffffffffffff;
    (this->Sequence).FirstRowIndex = 0;
    (this->Sequence).LastRowIndex = 0;
    (this->Sequence).Empty = true;
  }
  (this->Row).Discriminator = 0;
  puVar1 = &(this->Row).field_0x1d;
  *puVar1 = *puVar1 & 0xe5;
  return;
}

Assistant:

void DWARFDebugLine::ParsingState::appendRowToMatrix() {
  unsigned RowNumber = LineTable->Rows.size();
  if (Sequence.Empty) {
    // Record the beginning of instruction sequence.
    Sequence.Empty = false;
    Sequence.LowPC = Row.Address.Address;
    Sequence.FirstRowIndex = RowNumber;
  }
  LineTable->appendRow(Row);
  if (Row.EndSequence) {
    // Record the end of instruction sequence.
    Sequence.HighPC = Row.Address.Address;
    Sequence.LastRowIndex = RowNumber + 1;
    Sequence.SectionIndex = Row.Address.SectionIndex;
    if (Sequence.isValid())
      LineTable->appendSequence(Sequence);
    Sequence.reset();
  }
  Row.postAppend();
}